

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::write_obj_id_selfref(CTcDataStream *this,CTcSymObj *obj_sym)

{
  CTcSymObjBase *in_RSI;
  CTcDataStream *in_RDI;
  CTcDataStream *in_stack_ffffffffffffffd8;
  CTcSymObjBase *this_00;
  
  this_00 = in_RSI;
  get_ofs(in_RDI);
  CTcSymObjBase::add_self_ref_fixup(in_RSI,in_stack_ffffffffffffffd8,0x29d749);
  CTcSymObjBase::get_obj_id(this_00);
  write4((CTcDataStream *)this_00,(ulong)in_RDI);
  return;
}

Assistant:

void CTcDataStream::write_obj_id_selfref(CTcSymObj *obj_sym)
{
    /* 
     *   Add a fixup list entry to the symbol.  This type of reference
     *   must be kept with the symbol rather than in the global list,
     *   because we must apply this type of fixup each time we renumber
     *   the symbol. 
     */
    obj_sym->add_self_ref_fixup(this, get_ofs());

    /* write the ID to the stream */
    write4(obj_sym->get_obj_id());
}